

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::write<char>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *this,basic_string_view<char> s,
          format_specs *specs)

{
  ulong uVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  size_t num_code_points;
  ulong uVar4;
  str_writer<char> local_10;
  
  uVar2 = s.size_;
  local_10.s = s.data_;
  uVar1 = (ulong)specs->precision;
  local_10.size_ = uVar2;
  if ((-1 < (long)uVar1) && (uVar1 < uVar2)) {
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + 1;
      local_10.size_ = uVar3;
      if (uVar1 < uVar4) break;
      uVar3 = uVar3 + 1;
      local_10.size_ = uVar2;
    } while (uVar2 != uVar3);
  }
  basic_writer<duckdb_fmt::v6::buffer_range<char>>::
  write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::str_writer<char>>
            ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this,specs,&local_10);
  return;
}

Assistant:

void write(basic_string_view<Char> s, const format_specs& specs = {}) {
    const Char* data = s.data();
    std::size_t size = s.size();
    if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
      size = code_point_index(s, to_unsigned(specs.precision));
    write(data, size, specs);
  }